

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O2

frame_line<plot::RealCanvas<plot::BrailleCanvas>_*> * __thiscall
plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>::next
          (frame_line<plot::RealCanvas<plot::BrailleCanvas>_*> *__return_storage_ptr__,
          frame_line<plot::RealCanvas<plot::BrailleCanvas>_*> *this)

{
  block_t *pbVar1;
  long lVar2;
  const_iterator cVar3;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *pFVar4;
  block_iterator<plot::BrailleCanvas,_plot::detail::braille::line_t> __x;
  line_t lVar5;
  
  if (this->overflow_ == 0) {
    cVar3._M_current = (this->line_).line_.it_._M_current;
    if (cVar3._M_current != (this->end_).line_.it_._M_current) {
      pFVar4 = this->frame_;
      __x.line_.it_._M_current = cVar3._M_current;
      __x.line_.canvas_ = (this->line_).line_.canvas_;
      lVar5 = (line_t)std::
                      next<plot::detail::block_iterator<plot::BrailleCanvas,plot::detail::braille::line_t>>
                                (__x,1);
      lVar2 = 0;
      goto LAB_0010a8a3;
    }
  }
  else {
    cVar3._M_current = (this->line_).line_.it_._M_current;
  }
  pFVar4 = this->frame_;
  lVar5.it_._M_current = cVar3._M_current;
  lVar5.canvas_ = (this->line_).line_.canvas_;
  lVar2 = this->overflow_ + 1;
LAB_0010a8a3:
  pbVar1 = (this->end_).line_.it_._M_current;
  (__return_storage_ptr__->end_).line_.canvas_ = (this->end_).line_.canvas_;
  (__return_storage_ptr__->end_).line_.it_._M_current = pbVar1;
  __return_storage_ptr__->frame_ = pFVar4;
  __return_storage_ptr__->overflow_ = lVar2;
  (__return_storage_ptr__->line_).line_ = lVar5;
  return __return_storage_ptr__;
}

Assistant:

frame_line next() const {
            return (overflow_ || line_ == end_) ? frame_line(frame_, overflow_ + 1, line_, end_)
                                                : frame_line(frame_, overflow_, std::next(line_), end_);
        }